

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

IPStatsRecord * __thiscall IPStatsRecord::CreateCopy(IPStatsRecord *this)

{
  size_t __n;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  IPStatsRecord *pIVar8;
  
  pIVar8 = (IPStatsRecord *)operator_new(0x368);
  memset(pIVar8->ip_addr,0,0x360);
  __n = this->ipaddr_length;
  pIVar8->ipaddr_length = __n;
  pIVar8->query_volume = this->query_volume;
  uVar1 = this->no_such_domain_queries;
  pIVar8->arpa_count = this->arpa_count;
  pIVar8->no_such_domain_queries = uVar1;
  uVar1 = this->no_such_domain_frequent;
  pIVar8->no_such_domain_reserved = this->no_such_domain_reserved;
  pIVar8->no_such_domain_frequent = uVar1;
  pIVar8->no_such_domain_chromioids = this->no_such_domain_chromioids;
  memcpy(pIVar8->ip_addr,this->ip_addr,__n);
  memcpy(pIVar8->hourly_volume,this->hourly_volume,0xc0);
  memcpy(pIVar8->daily_volume,this->daily_volume,0xf8);
  uVar1 = this->tld_counts[1];
  uVar2 = this->tld_counts[2];
  uVar3 = this->tld_counts[3];
  uVar4 = this->tld_counts[4];
  uVar5 = this->tld_counts[5];
  uVar6 = this->tld_counts[6];
  uVar7 = this->tld_counts[7];
  pIVar8->tld_counts[0] = this->tld_counts[0];
  pIVar8->tld_counts[1] = uVar1;
  pIVar8->tld_counts[2] = uVar2;
  pIVar8->tld_counts[3] = uVar3;
  pIVar8->tld_counts[4] = uVar4;
  pIVar8->tld_counts[5] = uVar5;
  pIVar8->tld_counts[6] = uVar6;
  pIVar8->tld_counts[7] = uVar7;
  HyperLogLog::AddLogs(&pIVar8->tld_hyperlog,&this->tld_hyperlog);
  uVar1 = this->sld_counts[0];
  uVar2 = this->sld_counts[1];
  uVar3 = this->sld_counts[2];
  uVar4 = this->sld_counts[3];
  uVar5 = this->sld_counts[4];
  uVar6 = this->sld_counts[5];
  uVar7 = this->sld_counts[7];
  pIVar8->sld_counts[6] = this->sld_counts[6];
  pIVar8->sld_counts[7] = uVar7;
  pIVar8->sld_counts[4] = uVar5;
  pIVar8->sld_counts[5] = uVar6;
  pIVar8->sld_counts[2] = uVar3;
  pIVar8->sld_counts[3] = uVar4;
  pIVar8->sld_counts[0] = uVar1;
  pIVar8->sld_counts[1] = uVar2;
  HyperLogLog::AddLogs(&pIVar8->sld_hyperlog,&this->sld_hyperlog);
  uVar1 = this->name_parts[0];
  uVar2 = this->name_parts[1];
  uVar3 = this->name_parts[2];
  uVar4 = this->name_parts[3];
  uVar5 = this->name_parts[4];
  uVar6 = this->name_parts[5];
  uVar7 = this->name_parts[7];
  pIVar8->name_parts[6] = this->name_parts[6];
  pIVar8->name_parts[7] = uVar7;
  pIVar8->name_parts[4] = uVar5;
  pIVar8->name_parts[5] = uVar6;
  pIVar8->name_parts[2] = uVar3;
  pIVar8->name_parts[3] = uVar4;
  pIVar8->name_parts[0] = uVar1;
  pIVar8->name_parts[1] = uVar2;
  uVar1 = this->rr_types[1];
  uVar2 = this->rr_types[2];
  uVar3 = this->rr_types[3];
  uVar4 = this->rr_types[4];
  uVar5 = this->rr_types[5];
  uVar6 = this->rr_types[6];
  uVar7 = this->rr_types[7];
  pIVar8->rr_types[0] = this->rr_types[0];
  pIVar8->rr_types[1] = uVar1;
  pIVar8->rr_types[2] = uVar2;
  pIVar8->rr_types[3] = uVar3;
  pIVar8->rr_types[4] = uVar4;
  pIVar8->rr_types[5] = uVar5;
  pIVar8->rr_types[6] = uVar6;
  pIVar8->rr_types[7] = uVar7;
  uVar1 = this->locales[1];
  uVar2 = this->locales[2];
  uVar3 = this->locales[3];
  uVar4 = this->locales[4];
  uVar5 = this->locales[5];
  uVar6 = this->locales[6];
  uVar7 = this->locales[7];
  pIVar8->locales[0] = this->locales[0];
  pIVar8->locales[1] = uVar1;
  pIVar8->locales[2] = uVar2;
  pIVar8->locales[3] = uVar3;
  pIVar8->locales[4] = uVar4;
  pIVar8->locales[5] = uVar5;
  pIVar8->locales[6] = uVar6;
  pIVar8->locales[7] = uVar7;
  return pIVar8;
}

Assistant:

IPStatsRecord* IPStatsRecord::CreateCopy()
{
    IPStatsRecord * isr = new IPStatsRecord();

    if (isr != NULL) {
        isr->ipaddr_length = ipaddr_length;
        isr->query_volume = query_volume;
        isr->arpa_count = arpa_count;
        isr->no_such_domain_queries = no_such_domain_queries;
        isr->no_such_domain_reserved = no_such_domain_reserved;
        isr->no_such_domain_frequent = no_such_domain_frequent;
        isr->no_such_domain_chromioids = no_such_domain_chromioids;

        memcpy(isr->ip_addr, ip_addr, ipaddr_length);
        memcpy(isr->hourly_volume, hourly_volume, sizeof(hourly_volume));
        memcpy(isr->daily_volume, daily_volume, sizeof(daily_volume));
        memcpy(isr->tld_counts, tld_counts, sizeof(tld_counts));
        isr->tld_hyperlog.AddLogs(&tld_hyperlog);
        memcpy(isr->sld_counts, sld_counts, sizeof(sld_counts));
        isr->sld_hyperlog.AddLogs(&sld_hyperlog);
        memcpy(isr->name_parts, name_parts, sizeof(name_parts));
        memcpy(isr->rr_types, rr_types, sizeof(rr_types));
        memcpy(isr->locales, locales, sizeof(locales));
    }
    return isr;
}